

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConstantPadLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint __val;
  bool bVar1;
  ConstantPaddingLayerParams *this_00;
  uint64 uVar2;
  uint64 uVar3;
  int iVar4;
  int __val_00;
  int index;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Result r;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,2);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar1 = Result::good(&r);
  if (bVar1) {
    index = 1;
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    bVar1 = Result::good(&r);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_50,"ConstantPad",(allocator *)&local_f8);
      validateInputOutputRankEquality((Result *)&err,layer,&local_50,&this->blobNameToRank);
      Result::operator=(&r,(Result *)&err);
      std::__cxx11::string::~string((string *)&err._M_string_length);
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = Result::good(&r);
      if ((bVar1) &&
         (this_00 = Specification::NeuralNetworkLayer::constantpad(layer),
         (layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
        __val = (this_00->padamounts_).current_size_;
        if ((__val & 1) == 0) {
          if (__val != 0) {
            if (this_00->padtogivenoutputsizemode_ == true) {
              __val_00 = 0;
              iVar4 = (int)__val >> 1;
              if ((int)__val >> 1 < 1) {
                iVar4 = __val_00;
              }
              for (; iVar4 != __val_00; __val_00 = __val_00 + 1) {
                uVar2 = Specification::ConstantPaddingLayerParams::padamounts(this_00,index + -1);
                uVar3 = Specification::ConstantPaddingLayerParams::padamounts(this_00,index);
                if ((0 < (int)uVar2) && (0 < (int)uVar3)) {
                  std::operator+(&local_b8,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
                  std::operator+(&local_98,&local_b8,
                                 "\', \'padToGivenOutputSizeMode\' is true, and both padding values corresponding to dimension "
                                );
                  std::__cxx11::to_string(&local_d8,__val_00);
                  std::operator+(&local_f8,&local_98,&local_d8);
                  std::operator+(&err,&local_f8,
                                 " are non zero, which is invalid. Only one value can be non-zero.")
                  ;
                  std::__cxx11::string::~string((string *)&local_f8);
                  std::__cxx11::string::~string((string *)&local_d8);
                  std::__cxx11::string::~string((string *)&local_98);
                  std::__cxx11::string::~string((string *)&local_b8);
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
                  goto LAB_00257bfb;
                }
                index = index + 2;
              }
            }
            goto LAB_00257a18;
          }
          std::operator+(&local_f8,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
          std::operator+(&err,&local_f8,
                         "\', length of \'padAmounts\' cannot be zero when only 1 input is provided."
                        );
          std::__cxx11::string::~string((string *)&local_f8);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        }
        else {
          std::operator+(&local_b8,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
          std::operator+(&local_98,&local_b8,"\', length of \'padAmounts\' parameter is ");
          std::__cxx11::to_string(&local_d8,__val);
          std::operator+(&local_f8,&local_98,&local_d8);
          std::operator+(&err,&local_f8,", an odd value, which is not allowed.");
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        }
LAB_00257bfb:
        std::__cxx11::string::~string((string *)&err);
        goto LAB_00257a2d;
      }
    }
  }
LAB_00257a18:
  Result::Result(__return_storage_ptr__,&r);
LAB_00257a2d:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConstantPadLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 2);
    if (!r.good()) {return r;}
    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}
    r = validateInputOutputRankEquality(layer, "ConstantPad", blobNameToRank);
    if (!r.good()) {return r;}

    const auto& params = layer.constantpad();

    if (layer.input_size() == 1) {
        int len = params.padamounts_size();
        if (len % 2 != 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' parameter is " + std::to_string(len) + ", an odd value, which is not allowed.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (len == 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' cannot be zero when only 1 input is provided.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (params.padtogivenoutputsizemode()) {
            for (int i=0; i < len/2; i++) {
                int pad_a = (int)params.padamounts(2*i);
                int pad_b = (int)params.padamounts(2*i+1);
                if (pad_a > 0 && pad_b > 0) {
                    const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', 'padToGivenOutputSizeMode' is true, and both padding values corresponding to dimension " + std::to_string(i) + " are non zero, which is invalid. Only one value can be non-zero.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return r;
}